

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Scl_Item_t * Scl_LibertyReadPinTiming(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  Scl_Item_t *pSVar4;
  Scl_Item_t *pSVar5;
  
  uVar1 = pPinOut->Child;
  if ((int)uVar1 < p->nItems) {
    if ((int)uVar1 < 0) {
      pSVar5 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar5 = p->pItems + uVar1;
    }
    while( true ) {
      if (pSVar5 == (Scl_Item_t *)0x0) {
        return (Scl_Item_t *)0x0;
      }
      iVar3 = (pSVar5->Key).Beg;
      iVar2 = (pSVar5->Key).End - iVar3;
      iVar3 = strncmp(p->pContents + iVar3,"timing",(long)iVar2);
      if (iVar2 == 6 && iVar3 == 0) {
        uVar1 = pSVar5->Child;
        while( true ) {
          if (p->nItems <= (int)uVar1) goto LAB_00465605;
          if ((int)uVar1 < 0) {
            pSVar4 = (Scl_Item_t *)0x0;
          }
          else {
            pSVar4 = p->pItems + uVar1;
          }
          if (pSVar4 == (Scl_Item_t *)0x0) break;
          iVar3 = (pSVar4->Key).Beg;
          iVar2 = (pSVar4->Key).End - iVar3;
          iVar3 = strncmp(p->pContents + iVar3,"related_pin",(long)iVar2);
          if (iVar2 == 0xb && iVar3 == 0) {
            __s1 = Scl_LibertyReadString(p,pSVar4->Head);
            iVar3 = strcmp(__s1,pNameIn);
            if (iVar3 == 0) {
              return pSVar5;
            }
          }
          uVar1 = pSVar4->Next;
        }
      }
      uVar1 = pSVar5->Next;
      if (p->nItems <= (int)uVar1) break;
      if ((int)uVar1 < 0) {
        pSVar5 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar5 = p->pItems + uVar1;
      }
    }
  }
LAB_00465605:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

Scl_Item_t * Scl_LibertyReadPinTiming( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Scl_Item_t * pTiming, * pPinIn;
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                return pTiming;
    return NULL;
}